

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderCommonFunctionTests.cpp
# Opt level: O0

deUint32 deqp::gles3::Functional::getUlpDiffIgnoreZeroSign(float a,float b)

{
  bool bVar1;
  int iVar2;
  size_t *in_RCX;
  uchar *sig;
  uchar *sig_00;
  EVP_PKEY_CTX *in_RSI;
  uchar *in_R8;
  size_t in_R9;
  float fVar3;
  float b_00;
  Float<unsigned_int,_8,_23,_127,_3U> local_2c;
  Float<unsigned_int,_8,_23,_127,_3U> local_28;
  Float<unsigned_int,_8,_23,_127,_3U> local_24;
  Float<unsigned_int,_8,_23,_127,_3U> local_20;
  Float<unsigned_int,_8,_23,_127,_3U> local_1c;
  Float<unsigned_int,_8,_23,_127,_3U> local_18;
  float local_14;
  float local_10;
  float b_local;
  float a_local;
  
  local_14 = b;
  local_10 = a;
  tcu::Float<unsigned_int,_8,_23,_127,_3U>::Float(&local_18,a);
  bVar1 = tcu::Float<unsigned_int,_8,_23,_127,_3U>::isZero(&local_18);
  if (bVar1) {
    tcu::Float<unsigned_int,_8,_23,_127,_3U>::Float(&local_20,local_14);
    iVar2 = tcu::Float<unsigned_int,_8,_23,_127,_3U>::sign(&local_20,in_RSI,sig,in_RCX,in_R8,in_R9);
    local_1c = tcu::Float<unsigned_int,_8,_23,_127,_3U>::construct(iVar2,0,0);
    fVar3 = tcu::Float<unsigned_int,_8,_23,_127,_3U>::asFloat(&local_1c);
    b_local = (float)getUlpDiff(fVar3,local_14);
  }
  else {
    tcu::Float<unsigned_int,_8,_23,_127,_3U>::Float(&local_24,local_14);
    bVar1 = tcu::Float<unsigned_int,_8,_23,_127,_3U>::isZero(&local_24);
    fVar3 = local_10;
    if (bVar1) {
      tcu::Float<unsigned_int,_8,_23,_127,_3U>::Float(&local_2c,local_10);
      iVar2 = tcu::Float<unsigned_int,_8,_23,_127,_3U>::sign
                        (&local_2c,in_RSI,sig_00,in_RCX,in_R8,in_R9);
      local_28 = tcu::Float<unsigned_int,_8,_23,_127,_3U>::construct(iVar2,0,0);
      b_00 = tcu::Float<unsigned_int,_8,_23,_127,_3U>::asFloat(&local_28);
      b_local = (float)getUlpDiff(fVar3,b_00);
    }
    else {
      b_local = (float)getUlpDiff(local_10,local_14);
    }
  }
  return (deUint32)b_local;
}

Assistant:

inline deUint32 getUlpDiffIgnoreZeroSign (float a, float b)
{
	if (tcu::Float32(a).isZero())
		return getUlpDiff(tcu::Float32::construct(tcu::Float32(b).sign(), 0, 0).asFloat(), b);
	else if (tcu::Float32(b).isZero())
		return getUlpDiff(a, tcu::Float32::construct(tcu::Float32(a).sign(), 0, 0).asFloat());
	else
		return getUlpDiff(a, b);
}